

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Literal * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface::load
          (Literal *__return_storage_ptr__,ExternalInterface *this,Load *load,Address addr,
          Name memory)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  undefined4 extraout_var_01;
  size_t sVar5;
  char *pcVar6;
  float fVar7;
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  undefined8 local_18;
  
  pcVar6 = memory.super_IString.str._M_str;
  sVar5 = memory.super_IString.str._M_len;
  switch((load->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id) {
  case 0:
  case 1:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                       ,0xb13);
  case 2:
    uVar1 = load->bytes;
    if (uVar1 == '\x04') {
      uVar3 = (*this->_vptr_ExternalInterface[0x11])(this,addr.addr,sVar5,pcVar6);
    }
    else if (uVar1 == '\x02') {
      if (load->signed_ == true) {
        iVar2 = (*this->_vptr_ExternalInterface[0xf])(this,addr.addr,sVar5,pcVar6);
        uVar3 = (uint)(short)iVar2;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar5,pcVar6);
        uVar3 = uVar3 & 0xffff;
      }
    }
    else {
      if (uVar1 != '\x01') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0xae7);
      }
      if (load->signed_ == true) {
        iVar2 = (*this->_vptr_ExternalInterface[0xd])(this,addr.addr,sVar5,pcVar6);
        uVar3 = (uint)(char)iVar2;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0xe])(this,addr.addr,sVar5,pcVar6);
        uVar3 = uVar3 & 0xff;
      }
    }
    *(uint *)&__return_storage_ptr__->field_0 = uVar3;
    (__return_storage_ptr__->type).id = 2;
    break;
  case 3:
    switch(load->bytes) {
    case '\x01':
      if (load->signed_ == true) {
        iVar2 = (*this->_vptr_ExternalInterface[0xd])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)(char)iVar2;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0xe])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)(uVar3 & 0xff);
      }
      break;
    case '\x02':
      if (load->signed_ == true) {
        iVar2 = (*this->_vptr_ExternalInterface[0xf])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)(short)iVar2;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)(uVar3 & 0xffff);
      }
      break;
    default:
      handle_unreachable("invalid size",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                         ,0xaf9);
    case '\x04':
      if (load->signed_ == true) {
        iVar2 = (*this->_vptr_ExternalInterface[0x11])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)iVar2;
      }
      else {
        uVar3 = (*this->_vptr_ExternalInterface[0x12])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)uVar3;
      }
      break;
    case '\b':
      iVar2 = (*this->_vptr_ExternalInterface[0x13])(this,addr.addr,sVar5,pcVar6);
      uVar4 = CONCAT44(extraout_var_01,iVar2);
    }
    (__return_storage_ptr__->field_0).i64 = uVar4;
    (__return_storage_ptr__->type).id = 3;
    break;
  case 4:
    if (load->bytes == '\x04') {
      local_28.i32 = (*this->_vptr_ExternalInterface[0x12])(this,addr.addr,sVar5,pcVar6);
      local_18 = 2;
      Literal::castToF32(__return_storage_ptr__,(Literal *)&local_28.func);
    }
    else {
      if (load->bytes != '\x02') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0xb09);
      }
      uVar3 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar5,pcVar6);
      if (uVar3 << 0x11 < 0x8000000) {
        fVar7 = (float)(uVar3 & 0x7fff | 0x3f000000) + -0.5;
      }
      else {
        fVar7 = (float)((uVar3 << 0x11) >> 4 | 0x70000000) * 1.92593e-34;
      }
      local_28.i32 = (int)(short)uVar3 & 0x80000000U | (uint)fVar7;
      local_18 = 2;
      Literal::castToF32(__return_storage_ptr__,(Literal *)&local_28.func);
    }
    goto LAB_00d10b54;
  case 5:
    iVar2 = (*this->_vptr_ExternalInterface[0x14])(this,addr.addr,sVar5,pcVar6);
    local_28.i64 = CONCAT44(extraout_var_00,iVar2);
    local_18 = 3;
    Literal::castToF64(__return_storage_ptr__,(Literal *)&local_28.func);
LAB_00d10b54:
    Literal::~Literal((Literal *)&local_28.func);
    break;
  case 6:
    iVar2 = (*this->_vptr_ExternalInterface[0x15])
                      (this,addr.addr,(load->memory).super_IString.str._M_len,
                       (load->memory).super_IString.str._M_str);
    local_28.i64 = CONCAT44(extraout_var,iVar2);
    Literal::Literal(__return_storage_ptr__,local_28.v128);
    break;
  default:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  return __return_storage_ptr__;
}

Assistant:

virtual Literal load(Load* load, Address addr, Name memory) {
      switch (load->type.getBasic()) {
        case Type::i32: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int32_t)load8s(addr, memory))
                                   : Literal((int32_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int32_t)load16s(addr, memory))
                                   : Literal((int32_t)load16u(addr, memory));
            case 4:
              return Literal((int32_t)load32s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::i64: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int64_t)load8s(addr, memory))
                                   : Literal((int64_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int64_t)load16s(addr, memory))
                                   : Literal((int64_t)load16u(addr, memory));
            case 4:
              return load->signed_ ? Literal((int64_t)load32s(addr, memory))
                                   : Literal((int64_t)load32u(addr, memory));
            case 8:
              return Literal((int64_t)load64s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::f32: {
          switch (load->bytes) {
            case 2: {
              // Convert the float16 to float32 and store the binary
              // representation.
              return Literal(bit_cast<int32_t>(
                               fp16_ieee_to_fp32_value(load16u(addr, memory))))
                .castToF32();
            }
            case 4:
              return Literal(load32u(addr, memory)).castToF32();
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::f64:
          return Literal(load64u(addr, memory)).castToF64();
        case Type::v128:
          return Literal(load128(addr, load->memory).data());
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      WASM_UNREACHABLE("invalid type");
    }